

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,SPxId *enterId)

{
  uint *puVar1;
  pointer pnVar2;
  bool bVar3;
  undefined8 uVar4;
  int iVar5;
  DataKey DVar6;
  long lVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  lVar7 = (long)(((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->thecovectors->set).thenum;
  if (0 < lVar7) {
    lVar8 = lVar7 * 0x38 + -8;
    do {
      pnVar2 = (((this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar8 + -0x10);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar8 + -0x30);
      local_a8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar8 + -0x20);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_a8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_a8.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar8 + -8);
      local_a8.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar8 + -4);
      local_a8._48_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar8);
      local_68.data._M_elems._32_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 8);
      local_68.data._M_elems._0_8_ =
           *(undefined8 *)
            (this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems;
      local_68.data._M_elems._8_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 2);
      local_68.data._M_elems._16_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 4);
      local_68.data._M_elems._24_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 6);
      local_68.exp = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.exp;
      local_68.neg = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.neg;
      local_68.fpclass =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.fpclass;
      local_68.prec_elem =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.prec_elem;
      if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
        local_68.neg = (bool)(local_68.neg ^ 1);
      }
      if ((((local_68.fpclass != cpp_dec_float_NaN && local_a8.fpclass != cpp_dec_float_NaN) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_a8,&local_68), iVar5 < 0)) &&
          (local_a8.fpclass != cpp_dec_float_NaN)) &&
         (((best->m_backend).fpclass != cpp_dec_float_NaN &&
          (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_a8,&best->m_backend), iVar5 < 0)))) {
        DVar6 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::coId((this->
                                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).thesolver,(int)lVar7 + -1);
        enterId->super_DataKey = DVar6;
        *(undefined8 *)(best->m_backend).data._M_elems = local_a8.data._M_elems._0_8_;
        *(undefined8 *)((best->m_backend).data._M_elems + 2) = local_a8.data._M_elems._8_8_;
        *(undefined8 *)((best->m_backend).data._M_elems + 4) = local_a8.data._M_elems._16_8_;
        *(ulong *)((best->m_backend).data._M_elems + 6) =
             CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
        *(undefined8 *)((best->m_backend).data._M_elems + 8) = local_a8.data._M_elems._32_8_;
        (best->m_backend).exp = local_a8.exp;
        (best->m_backend).neg = local_a8.neg;
        (best->m_backend).fpclass = local_a8.fpclass;
        (best->m_backend).prec_elem = local_a8.prec_elem;
      }
      lVar8 = lVar8 + -0x38;
      bVar3 = 1 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar3);
  }
  return (SPxId)enterId->super_DataKey;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterDenseDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   R x;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = this->thesolver->coTest()[i];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId   = this->thesolver->coId(i);
            best = x;
         }
      }
   }

   return enterId;
}